

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSpvAsmInstructionTests.cpp
# Opt level: O2

void vkt::SpirVAssembly::(anonymous_namespace)::fillRandomInt64sLogDistributed<bool(*)(long)>
               (Random *rnd,vector<long,_std::allocator<long>_> *dst,int numValues,
               _func_bool_long *filter)

{
  char cVar1;
  deInt64 dVar2;
  undefined4 in_register_00000014;
  int ndx;
  long lVar3;
  
  for (lVar3 = 0; lVar3 != 200; lVar3 = lVar3 + 1) {
    do {
      dVar2 = anon_unknown_5::randomInt64LogDistributed(rnd);
      cVar1 = (*(code *)CONCAT44(in_register_00000014,numValues))(dVar2);
    } while (cVar1 == '\0');
    (dst->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data._M_start
    [lVar3] = dVar2;
  }
  return;
}

Assistant:

static void fillRandomInt64sLogDistributed (de::Random& rnd, vector<deInt64>& dst, int numValues, FilterT filter)
{
	for (int ndx = 0; ndx < numValues; ndx++)
	{
		deInt64 value;
		do {
			value = randomInt64LogDistributed(rnd);
		} while (!filter(value));
		dst[ndx] = value;
	}
}